

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walTryBeginRead(Wal *pWal,int *pChanged,int useWal,int cnt)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  u32 *puVar4;
  sqlite3_file *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  u32 uVar10;
  u32 uVar11;
  u32 uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  u8 *aFrame;
  int iVar17;
  int iVar18;
  int i;
  uint uVar19;
  long in_FS_OFFSET;
  u32 ***local_a0;
  u32 local_94;
  i64 szWal;
  u8 *local_88;
  u32 pgno;
  undefined8 local_78;
  undefined8 uStack_70;
  void *pDummy;
  u8 aBuf [32];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (5 < cnt) {
    if (100 < (uint)cnt) {
      uVar13 = 0xf;
      goto LAB_001291a2;
    }
    iVar18 = (cnt + -9) * (cnt + -9) * 0x27;
    if ((uint)cnt < 10) {
      iVar18 = 1;
    }
    (*pWal->pVfs->xSleep)(pWal->pVfs,iVar18);
  }
  if (useWal != 0) {
    puVar4 = *pWal->apWiData;
    uVar13 = 0;
    goto LAB_00128f3e;
  }
  if (pWal->bShmUnreliable == '\0') {
    uVar13 = walIndexReadHdr(pWal,pChanged);
    if (uVar13 == 0) {
      if (pWal->bShmUnreliable != '\0') goto LAB_00128fb3;
      puVar4 = *pWal->apWiData;
      uVar13 = 0;
      if (puVar4[0x18] == (pWal->hdr).mxFrame) {
        uVar13 = walLockShared(pWal,3);
        walShmBarrier(pWal);
        if (uVar13 == 5) goto LAB_00128f3e;
        if (uVar13 != 0) goto LAB_001291a2;
        iVar18 = bcmp(*pWal->apWiData,&pWal->hdr,0x30);
        if (iVar18 == 0) {
          pWal->readLock = 0;
          goto LAB_0012923e;
        }
        iVar18 = 3;
      }
      else {
LAB_00128f3e:
        local_a0 = &pWal->apWiData;
        uVar14 = (pWal->hdr).mxFrame;
        iVar17 = 0;
        uVar19 = 0;
        for (lVar16 = 2; lVar16 != 6; lVar16 = lVar16 + 1) {
          uVar2 = (puVar4 + 0x18)[lVar16];
          if (uVar2 <= uVar14 && uVar19 <= uVar2) {
            iVar17 = (int)lVar16 + -1;
            uVar19 = uVar2;
          }
        }
        if ((pWal->readOnly & 2) == 0) {
          if ((uVar19 < uVar14) || (iVar17 == 0)) {
            for (lVar16 = 0; iVar18 = (int)lVar16, iVar18 != 4; lVar16 = lVar16 + 1) {
              uVar13 = walLockExclusive(pWal,iVar18 + 4,1);
              if (uVar13 != 5) {
                if (uVar13 != 0) goto LAB_001291a2;
                puVar4[lVar16 + 0x1a] = uVar14;
                walUnlockExclusive(pWal,iVar18 + 4,1);
                iVar17 = iVar18 + 1;
                uVar19 = uVar14;
                goto LAB_00128fe1;
              }
              uVar13 = 5;
            }
            goto LAB_00128fd9;
          }
        }
        else {
LAB_00128fd9:
          if (iVar17 == 0) {
            uVar13 = -(uint)(uVar13 == 5) | 0x508;
            goto LAB_001291a2;
          }
        }
LAB_00128fe1:
        iVar18 = iVar17 + 3;
        uVar14 = walLockShared(pWal,iVar18);
        if (uVar14 != 0) {
          uVar13 = 0xffffffff;
          goto LAB_00128ffa;
        }
        pWal->minFrame = puVar4[0x18] + 1;
        walShmBarrier(pWal);
        if ((puVar4[(long)iVar17 + 0x19] == uVar19) &&
           (iVar15 = bcmp(**local_a0,&pWal->hdr,0x30), iVar15 == 0)) {
          pWal->readLock = (i16)iVar17;
LAB_0012923e:
          uVar13 = 0;
          goto LAB_001291a2;
        }
      }
      walUnlockShared(pWal,iVar18);
      uVar13 = 0xffffffff;
    }
    else {
      if ((uVar13 != 5) || (uVar13 = 0xffffffff, *pWal->apWiData == (u32 *)0x0)) goto LAB_001291a2;
      uVar14 = walLockShared(pWal,2);
      if (uVar14 == 0) {
        walUnlockShared(pWal,2);
        uVar13 = 0xffffffff;
        goto LAB_001291a2;
      }
      uVar13 = 0x105;
LAB_00128ffa:
      if (uVar14 != 5) {
        uVar13 = uVar14;
      }
    }
    goto LAB_001291a2;
  }
LAB_00128fb3:
  uVar14 = walLockShared(pWal,3);
  if (uVar14 == 0) {
    pWal->readLock = 0;
    uVar13 = (*pWal->pDbFd->pMethods->xShmMap)(pWal->pDbFd,0,0x8000,0,&pDummy);
    if (uVar13 == 8) {
      uVar13 = 0xffffffff;
      goto LAB_00128fd1;
    }
    if (uVar13 == 0x508) {
      psVar5 = pWal->pWalFd;
      puVar4 = *pWal->apWiData;
      uVar10 = puVar4[1];
      uVar6 = *(undefined8 *)(puVar4 + 2);
      uVar11 = puVar4[4];
      uVar12 = puVar4[5];
      uVar7 = *(undefined8 *)(puVar4 + 6);
      uVar8 = *(undefined8 *)(puVar4 + 8);
      uVar9 = *(undefined8 *)(puVar4 + 10);
      (pWal->hdr).iVersion = puVar4[0];
      (pWal->hdr).unused = uVar10;
      (pWal->hdr).iChange = (int)uVar6;
      (pWal->hdr).isInit = (char)((ulong)uVar6 >> 0x20);
      (pWal->hdr).bigEndCksum = (char)((ulong)uVar6 >> 0x28);
      (pWal->hdr).szPage = (short)((ulong)uVar6 >> 0x30);
      (pWal->hdr).mxFrame = uVar11;
      (pWal->hdr).nPage = uVar12;
      *(undefined8 *)(pWal->hdr).aFrameCksum = uVar7;
      *(undefined8 *)(pWal->hdr).aSalt = uVar8;
      *(undefined8 *)(pWal->hdr).aCksum = uVar9;
      uVar13 = (*psVar5->pMethods->xFileSize)(psVar5,&szWal);
      if (uVar13 != 0) goto LAB_00129151;
      if (szWal < 0x20) {
        *pChanged = 1;
        aFrame = (u8 *)0x0;
        uVar13 = -(uint)((pWal->hdr).mxFrame != 0);
      }
      else {
        uVar13 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aBuf,0x20,0);
        if (uVar13 != 0) goto LAB_00129151;
        if (*(long *)(pWal->hdr).aSalt == aBuf._16_8_) {
          iVar18 = pWal->szPage + 0x18;
          aFrame = (u8 *)sqlite3_malloc64((long)iVar18);
          if (aFrame == (u8 *)0x0) {
            uVar13 = 7;
            goto LAB_00128fd1;
          }
          local_88 = aFrame + 0x18;
          local_78 = *(undefined8 *)(pWal->hdr).aFrameCksum;
          uStack_70 = 0;
          lVar16 = (ulong)(pWal->szPage + 0x18) * (ulong)(pWal->hdr).mxFrame + 0x20;
          do {
            lVar1 = lVar16 + iVar18;
            if (szWal < lVar1) {
LAB_0012935d:
              uVar13 = 0;
              break;
            }
            uVar13 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aFrame,iVar18,lVar16);
            if (uVar13 != 0) break;
            iVar17 = walDecodeFrame(pWal,&pgno,&local_94,local_88,aFrame);
            if (iVar17 == 0) goto LAB_0012935d;
            lVar16 = lVar1;
            uVar13 = 0xffffffff;
          } while (local_94 == 0);
          *(undefined8 *)(pWal->hdr).aFrameCksum = local_78;
        }
        else {
          aFrame = (u8 *)0x0;
          uVar13 = 0xffffffff;
        }
      }
    }
    else {
LAB_00129151:
      aFrame = (u8 *)0x0;
    }
  }
  else {
    uVar13 = 0xffffffff;
    if (uVar14 != 5) {
      uVar13 = uVar14;
    }
LAB_00128fd1:
    aFrame = (u8 *)0x0;
  }
  sqlite3_free(aFrame);
  if (uVar13 != 0) {
    for (lVar16 = 0; lVar16 < pWal->nWiData; lVar16 = lVar16 + 1) {
      sqlite3_free(pWal->apWiData[lVar16]);
      pWal->apWiData[lVar16] = (u32 *)0x0;
    }
    pWal->bShmUnreliable = '\0';
    sqlite3WalEndReadTransaction(pWal);
    *pChanged = 1;
  }
LAB_001291a2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return uVar13;
}

Assistant:

static int walTryBeginRead(Wal *pWal, int *pChanged, int useWal, int cnt){
  volatile WalCkptInfo *pInfo;    /* Checkpoint information in wal-index */
  u32 mxReadMark;                 /* Largest aReadMark[] value */
  int mxI;                        /* Index of largest aReadMark[] value */
  int i;                          /* Loop counter */
  int rc = SQLITE_OK;             /* Return code  */
  u32 mxFrame;                    /* Wal frame to lock to */

  assert( pWal->readLock<0 );     /* Not currently locked */

  /* useWal may only be set for read/write connections */
  assert( (pWal->readOnly & WAL_SHM_RDONLY)==0 || useWal==0 );

  /* Take steps to avoid spinning forever if there is a protocol error.
  **
  ** Circumstances that cause a RETRY should only last for the briefest
  ** instances of time.  No I/O or other system calls are done while the
  ** locks are held, so the locks should not be held for very long. But
  ** if we are unlucky, another process that is holding a lock might get
  ** paged out or take a page-fault that is time-consuming to resolve,
  ** during the few nanoseconds that it is holding the lock.  In that case,
  ** it might take longer than normal for the lock to free.
  **
  ** After 5 RETRYs, we begin calling sqlite3OsSleep().  The first few
  ** calls to sqlite3OsSleep() have a delay of 1 microsecond.  Really this
  ** is more of a scheduler yield than an actual delay.  But on the 10th
  ** an subsequent retries, the delays start becoming longer and longer,
  ** so that on the 100th (and last) RETRY we delay for 323 milliseconds.
  ** The total delay time before giving up is less than 10 seconds.
  */
  if( cnt>5 ){
    int nDelay = 1;                      /* Pause time in microseconds */
    if( cnt>100 ){
      VVA_ONLY( pWal->lockError = 1; )
      return SQLITE_PROTOCOL;
    }
    if( cnt>=10 ) nDelay = (cnt-9)*(cnt-9)*39;
    sqlite3OsSleep(pWal->pVfs, nDelay);
  }

  if( !useWal ){
    assert( rc==SQLITE_OK );
    if( pWal->bShmUnreliable==0 ){
      rc = walIndexReadHdr(pWal, pChanged);
    }
    if( rc==SQLITE_BUSY ){
      /* If there is not a recovery running in another thread or process
      ** then convert BUSY errors to WAL_RETRY.  If recovery is known to
      ** be running, convert BUSY to BUSY_RECOVERY.  There is a race here
      ** which might cause WAL_RETRY to be returned even if BUSY_RECOVERY
      ** would be technically correct.  But the race is benign since with
      ** WAL_RETRY this routine will be called again and will probably be
      ** right on the second iteration.
      */
      if( pWal->apWiData[0]==0 ){
        /* This branch is taken when the xShmMap() method returns SQLITE_BUSY.
        ** We assume this is a transient condition, so return WAL_RETRY. The
        ** xShmMap() implementation used by the default unix and win32 VFS
        ** modules may return SQLITE_BUSY due to a race condition in the
        ** code that determines whether or not the shared-memory region
        ** must be zeroed before the requested page is returned.
        */
        rc = WAL_RETRY;
      }else if( SQLITE_OK==(rc = walLockShared(pWal, WAL_RECOVER_LOCK)) ){
        walUnlockShared(pWal, WAL_RECOVER_LOCK);
        rc = WAL_RETRY;
      }else if( rc==SQLITE_BUSY ){
        rc = SQLITE_BUSY_RECOVERY;
      }
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    else if( pWal->bShmUnreliable ){
      return walBeginShmUnreliable(pWal, pChanged);
    }
  }

  assert( pWal->nWiData>0 );
  assert( pWal->apWiData[0]!=0 );
  pInfo = walCkptInfo(pWal);
  if( !useWal && AtomicLoad(&pInfo->nBackfill)==pWal->hdr.mxFrame
#ifdef SQLITE_ENABLE_SNAPSHOT
   && (pWal->pSnapshot==0 || pWal->hdr.mxFrame==0)
#endif
  ){
    /* The WAL has been completely backfilled (or it is empty).
    ** and can be safely ignored.
    */
    rc = walLockShared(pWal, WAL_READ_LOCK(0));
    walShmBarrier(pWal);
    if( rc==SQLITE_OK ){
      if( memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr)) ){
        /* It is not safe to allow the reader to continue here if frames
        ** may have been appended to the log before READ_LOCK(0) was obtained.
        ** When holding READ_LOCK(0), the reader ignores the entire log file,
        ** which implies that the database file contains a trustworthy
        ** snapshot. Since holding READ_LOCK(0) prevents a checkpoint from
        ** happening, this is usually correct.
        **
        ** However, if frames have been appended to the log (or if the log
        ** is wrapped and written for that matter) before the READ_LOCK(0)
        ** is obtained, that is not necessarily true. A checkpointer may
        ** have started to backfill the appended frames but crashed before
        ** it finished. Leaving a corrupt image in the database file.
        */
        walUnlockShared(pWal, WAL_READ_LOCK(0));
        return WAL_RETRY;
      }
      pWal->readLock = 0;
      return SQLITE_OK;
    }else if( rc!=SQLITE_BUSY ){
      return rc;
    }
  }

  /* If we get this far, it means that the reader will want to use
  ** the WAL to get at content from recent commits.  The job now is
  ** to select one of the aReadMark[] entries that is closest to
  ** but not exceeding pWal->hdr.mxFrame and lock that entry.
  */
  mxReadMark = 0;
  mxI = 0;
  mxFrame = pWal->hdr.mxFrame;
#ifdef SQLITE_ENABLE_SNAPSHOT
  if( pWal->pSnapshot && pWal->pSnapshot->mxFrame<mxFrame ){
    mxFrame = pWal->pSnapshot->mxFrame;
  }
#endif
  for(i=1; i<WAL_NREADER; i++){
    u32 thisMark = AtomicLoad(pInfo->aReadMark+i);
    if( mxReadMark<=thisMark && thisMark<=mxFrame ){
      assert( thisMark!=READMARK_NOT_USED );
      mxReadMark = thisMark;
      mxI = i;
    }
  }
  if( (pWal->readOnly & WAL_SHM_RDONLY)==0
   && (mxReadMark<mxFrame || mxI==0)
  ){
    for(i=1; i<WAL_NREADER; i++){
      rc = walLockExclusive(pWal, WAL_READ_LOCK(i), 1);
      if( rc==SQLITE_OK ){
        AtomicStore(pInfo->aReadMark+i,mxFrame);
        mxReadMark = mxFrame;
        mxI = i;
        walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
        break;
      }else if( rc!=SQLITE_BUSY ){
        return rc;
      }
    }
  }
  if( mxI==0 ){
    assert( rc==SQLITE_BUSY || (pWal->readOnly & WAL_SHM_RDONLY)!=0 );
    return rc==SQLITE_BUSY ? WAL_RETRY : SQLITE_READONLY_CANTINIT;
  }

  rc = walLockShared(pWal, WAL_READ_LOCK(mxI));
  if( rc ){
    return rc==SQLITE_BUSY ? WAL_RETRY : rc;
  }
  /* Now that the read-lock has been obtained, check that neither the
  ** value in the aReadMark[] array or the contents of the wal-index
  ** header have changed.
  **
  ** It is necessary to check that the wal-index header did not change
  ** between the time it was read and when the shared-lock was obtained
  ** on WAL_READ_LOCK(mxI) was obtained to account for the possibility
  ** that the log file may have been wrapped by a writer, or that frames
  ** that occur later in the log than pWal->hdr.mxFrame may have been
  ** copied into the database by a checkpointer. If either of these things
  ** happened, then reading the database with the current value of
  ** pWal->hdr.mxFrame risks reading a corrupted snapshot. So, retry
  ** instead.
  **
  ** Before checking that the live wal-index header has not changed
  ** since it was read, set Wal.minFrame to the first frame in the wal
  ** file that has not yet been checkpointed. This client will not need
  ** to read any frames earlier than minFrame from the wal file - they
  ** can be safely read directly from the database file.
  **
  ** Because a ShmBarrier() call is made between taking the copy of
  ** nBackfill and checking that the wal-header in shared-memory still
  ** matches the one cached in pWal->hdr, it is guaranteed that the
  ** checkpointer that set nBackfill was not working with a wal-index
  ** header newer than that cached in pWal->hdr. If it were, that could
  ** cause a problem. The checkpointer could omit to checkpoint
  ** a version of page X that lies before pWal->minFrame (call that version
  ** A) on the basis that there is a newer version (version B) of the same
  ** page later in the wal file. But if version B happens to like past
  ** frame pWal->hdr.mxFrame - then the client would incorrectly assume
  ** that it can read version A from the database file. However, since
  ** we can guarantee that the checkpointer that set nBackfill could not
  ** see any pages past pWal->hdr.mxFrame, this problem does not come up.
  */
  pWal->minFrame = AtomicLoad(&pInfo->nBackfill)+1;
  walShmBarrier(pWal);
  if( AtomicLoad(pInfo->aReadMark+mxI)!=mxReadMark
   || memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr))
  ){
    walUnlockShared(pWal, WAL_READ_LOCK(mxI));
    return WAL_RETRY;
  }else{
    assert( mxReadMark<=pWal->hdr.mxFrame );
    pWal->readLock = (i16)mxI;
  }
  return rc;
}